

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O3

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_atan2>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  uint extraout_EAX;
  uint uVar5;
  uint uVar6;
  long lVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [16];
  long lVar11;
  int iVar12;
  float fVar13;
  __m256 afVar14;
  undefined1 auVar16 [56];
  undefined1 auVar15 [64];
  __m128 afVar17;
  binary_op_atan2 op;
  __m256 _p1;
  __m256 _p;
  binary_op_atan2 local_105;
  int local_104;
  void *local_100;
  undefined1 (*local_f8) [16];
  Mat *local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  void *local_d0;
  Mat *local_c8;
  long local_c0;
  Mat *local_b8;
  long local_b0;
  void *local_a8;
  undefined1 local_a0 [32];
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  
  uVar4 = a->c;
  local_c0 = (long)(int)uVar4;
  if (0 < local_c0) {
    local_104 = a->h * a->w * a->d * a->elempack;
    local_b0 = 0;
    local_f0 = a;
    local_c8 = c;
    local_b8 = b;
    do {
      pvVar1 = local_f0->data;
      pvVar2 = local_b8->data;
      local_100 = (void *)local_b8->elemsize;
      pvVar3 = local_c8->data;
      if (local_104 < 8) {
        pfVar8 = (float *)((long)pvVar1 + local_f0->cstep * local_b0 * local_f0->elemsize);
        lVar11 = local_b8->cstep * local_b0 * (long)local_100;
        lVar7 = local_c8->cstep * local_b0 * local_c8->elemsize;
        uVar5 = 0;
      }
      else {
        local_e8 = local_f0->cstep * local_f0->elemsize * local_b0;
        local_f8 = (undefined1 (*) [16])(local_e8 + (long)pvVar1);
        local_e0 = local_c8->cstep * local_c8->elemsize * local_b0;
        local_a8 = (void *)(local_e0 + (long)pvVar3);
        local_d8 = local_b8->cstep * (long)local_100 * local_b0;
        local_100 = (void *)((long)pvVar2 + local_d8);
        lVar11 = 0;
        uVar4 = 0;
        local_d0 = pvVar1;
        do {
          pfVar8 = (float *)((long)*local_f8 + lVar11);
          local_80 = *(float (*) [2])pfVar8;
          afStack_78 = *(float (*) [2])(pfVar8 + 2);
          afStack_70 = *(float (*) [2])(pfVar8 + 4);
          afStack_68._0_8_ = *(undefined8 *)(pfVar8 + 6);
          local_a0 = *(undefined1 (*) [32])((long)local_100 + lVar11);
          afVar14 = (__m256)local_a0;
          BinaryOp_x86_fma_functor::binary_op_atan2::func_pack8
                    (&local_105,(__m256 *)local_80,(__m256 *)local_a0);
          *(__m256 *)((long)local_a8 + lVar11) = afVar14;
          uVar5 = uVar4 + 8;
          lVar11 = lVar11 + 0x20;
          iVar12 = uVar4 + 0xf;
          uVar4 = uVar5;
        } while (iVar12 < local_104);
        pfVar8 = (float *)((long)local_d0 + local_e8 + lVar11);
        lVar7 = local_e0 + lVar11;
        lVar11 = local_d8 + lVar11;
      }
      iVar12 = local_104;
      pauVar10 = (undefined1 (*) [16])((long)pvVar3 + lVar7);
      pauVar9 = (undefined1 (*) [16])((long)pvVar2 + lVar11);
      uVar4 = uVar5 | 3;
      uVar6 = uVar4;
      while ((int)uVar6 < iVar12) {
        local_80 = *(float (*) [2])pfVar8;
        afStack_78 = *(float (*) [2])(pfVar8 + 2);
        local_a0._0_16_ = *pauVar9;
        auVar16 = ZEXT856(*(ulong *)(*pauVar9 + 8));
        local_f8 = pauVar10;
        afVar17 = BinaryOp_x86_fma_functor::binary_op_atan2::func_pack4
                            (&local_105,(__m128 *)local_80,(__m128 *)local_a0);
        auVar15._0_8_ = afVar17._0_8_;
        auVar15._8_56_ = auVar16;
        *local_f8 = auVar15._0_16_;
        pfVar8 = pfVar8 + 4;
        pauVar9 = pauVar9 + 1;
        pauVar10 = local_f8 + 1;
        uVar4 = uVar5 + 4;
        uVar6 = uVar5 + 7;
        uVar5 = uVar4;
      }
      if ((int)uVar5 < iVar12) {
        lVar7 = 0;
        do {
          fVar13 = atan2f(pfVar8[lVar7],*(float *)(*pauVar9 + lVar7 * 4));
          *(float *)((long)*pauVar10 + lVar7 * 4) = fVar13;
          lVar7 = lVar7 + 1;
          uVar4 = extraout_EAX;
        } while (iVar12 - uVar5 != (int)lVar7);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != local_c0);
  }
  return uVar4;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}